

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForField
          (FileGenerator *this,FieldDescriptor *field,CrossFileReferences *refs)

{
  bool bVar1;
  LogMessage *other;
  __hashtable *__h;
  Descriptor *msg;
  __node_gen_type __node_gen;
  LogFinisher local_59;
  Descriptor *local_58;
  CrossFileReferences *local_50 [7];
  
  local_58 = FieldDescriptor::message_type(field);
  if (local_58 != (Descriptor *)0x0) {
    bVar1 = IsImplicitWeakField(field,&this->options_,&this->scc_analyzer_);
    if (!bVar1) {
      if (*(char *)(*(long *)(field + 0x38) + 0x4f) != '\x01') {
        return;
      }
      if ((this->options_).opensource_runtime == true) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.h"
                   ,0x138);
        other = internal::LogMessage::operator<<
                          ((LogMessage *)local_50,"CHECK failed: !options.opensource_runtime: ");
        internal::LogFinisher::operator=(&local_59,other);
        internal::LogMessage::~LogMessage((LogMessage *)local_50);
      }
    }
    local_50[0] = refs;
    std::
    _Hashtable<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>,std::__detail::_Identity,std::equal_to<google::protobuf::Descriptor_const*>,std::hash<google::protobuf::Descriptor_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<google::protobuf::Descriptor_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<google::protobuf::Descriptor_const*,false>>>>
              ((_Hashtable<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>,std::__detail::_Identity,std::equal_to<google::protobuf::Descriptor_const*>,std::hash<google::protobuf::Descriptor_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)refs,&local_58);
  }
  return;
}

Assistant:

void FileGenerator::GetCrossFileReferencesForField(const FieldDescriptor* field,
                                                   CrossFileReferences* refs) {
  const Descriptor* msg = field->message_type();
  if (msg == nullptr) return;

  if (IsImplicitWeakField(field, options_, &scc_analyzer_) ||
      IsWeak(field, options_)) {
    refs->weak_default_instances.insert(msg);
  }
}